

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

void __thiscall testing::internal::Mutex::Mutex(Mutex *this)

{
  int iVar1;
  GTestLog local_14;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6ab);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_mutex_init(&mutex_, nullptr)",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_14);
  }
  (this->super_MutexBase).has_owner_ = false;
  return;
}

Assistant:

Mutex() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_init(&mutex_, nullptr));
    has_owner_ = false;
  }